

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

ImWchar * ImGuiStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  StbUndoRecord *pSVar1;
  short sVar2;
  short sVar3;
  ImWchar *pIVar4;
  
  state->redo_point = 99;
  state->redo_char_point = 999;
  if (state->undo_point == 99) {
    stb_textedit_discard_undo(state);
  }
  if (insert_len < 1000) {
    sVar2 = state->undo_char_point;
    while (999 < sVar2 + insert_len) {
      stb_textedit_discard_undo(state);
      sVar2 = state->undo_char_point;
    }
    sVar3 = state->undo_point;
    state->undo_point = sVar3 + 1;
    pSVar1 = state->undo_rec + sVar3;
    pSVar1->where = pos;
    pSVar1->insert_length = (short)insert_len;
    pSVar1->delete_length = (short)delete_len;
    if (insert_len == 0) {
      pSVar1->char_storage = -1;
      pIVar4 = (ImWchar *)0x0;
    }
    else {
      pSVar1->char_storage = sVar2;
      state->undo_char_point = (short)insert_len + sVar2;
      pIVar4 = state->undo_char + sVar2;
    }
  }
  else {
    pIVar4 = (ImWchar *)0x0;
    state->undo_point = 0;
    state->undo_char_point = 0;
  }
  return pIVar4;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (short) insert_len;
   r->delete_length = (short) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point = state->undo_char_point + (short) insert_len;
      return &state->undo_char[r->char_storage];
   }
}